

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epc18_2.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinEPC18_2>::eval_exc_polar_impl
               (double rho_a,double rho_b,double *eps)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  double t40;
  double t39;
  double t38;
  double t35;
  double t33;
  double t32;
  double t31;
  double t28;
  double t27;
  double t25;
  double t22;
  double t21;
  double t19;
  double t18;
  double t17;
  double t16;
  double t14;
  double t13;
  double t12;
  double t9;
  double t8;
  double t5;
  double t4;
  double t3;
  double t24;
  double t23;
  bool local_e9;
  
  local_e9 = in_XMM0_Qa <= 1e-24 && in_XMM1_Qa <= 1e-24;
  dVar1 = 1.0 / (in_XMM0_Qa + in_XMM1_Qa);
  dVar2 = (double)(-(ulong)((in_XMM0_Qa + in_XMM0_Qa) * dVar1 <= 1e-15) & 0x3ff0000000000000);
  dVar3 = (double)(-(ulong)((in_XMM1_Qa + in_XMM1_Qa) * dVar1 <= 1e-15) & 0x3ff0000000000000);
  dVar4 = piecewise_functor_5<double>
                    (dVar2 != 0.0,-0.999999999999999,dVar3 != 0.0,0.999999999999999,
                     (in_XMM0_Qa - in_XMM1_Qa) * dVar1);
  dVar1 = piecewise_functor_5<double>
                    (dVar3 != 0.0,-0.999999999999999,dVar2 != 0.0,0.999999999999999,
                     -(in_XMM0_Qa - in_XMM1_Qa) * dVar1);
  dVar2 = safe_math::cbrt<double>(1.2186351484215e-317);
  dVar3 = safe_math::cbrt<double>(1.21865392291604e-317);
  dVar2 = (dVar2 * 1.5874010519681996) / 2.0 + (dVar3 * 1.5874010519681996) / 2.0;
  dVar3 = dVar2 * dVar2;
  dVar1 = piecewise_functor_3<double>
                    ((double)local_e9 != 0.0,0.0,
                     (-((dVar4 + 1.0) * (in_XMM0_Qa + in_XMM1_Qa)) *
                     (dVar1 + 1.0) *
                     (1.0 / (dVar3 * dVar3 * 0.06 * dVar3 + -(dVar3 * dVar2 * 0.5) + 3.9))) / 4.0);
  *in_RDI = dVar1;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double& eps ) {

    (void)(eps);
    constexpr double t23 = constants::m_cbrt_2;
    constexpr double t24 = t23 * t23;


    const double t3 = rho_a <= dens_tol && rho_b <= dens_tol;
    const double t4 = rho_a + rho_b;
    const double t5 = 0.1e1 / t4;
    const double t8 = 0.2e1 * rho_a * t5 <= zeta_tol;
    const double t9 = zeta_tol - 0.1e1;
    const double t12 = 0.2e1 * rho_b * t5 <= zeta_tol;
    const double t13 = -t9;
    const double t14 = rho_a - rho_b;
    const double t16 = piecewise_functor_5( t8, t9, t12, t13, t14 * t5 );
    const double t17 = 0.1e1 + t16;
    const double t18 = t17 * t4;
    const double t19 = -t14;
    const double t21 = piecewise_functor_5( t12, t9, t8, t13, t19 * t5 );
    const double t22 = 0.1e1 + t21;
    const double t25 = safe_math::cbrt( t18 );
    const double t27 = t22 * t4;
    const double t28 = safe_math::cbrt( t27 );
    const double t31 = t24 * t25 / 0.2e1 + t24 * t28 / 0.2e1;
    const double t32 = t31 * t31;
    const double t33 = t32 * t31;
    const double t35 = t32 * t32;
    const double t38 = c * t35 * t32 - b * t33 + a;
    const double t39 = 0.1e1 / t38;
    const double t40 = t22 * t39;


    eps = piecewise_functor_3( t3, 0.0, -t18 * t40 / 0.4e1 );

  }